

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3MPrintf(sqlite3 *db,char *zFormat,...)

{
  char in_AL;
  char *pcVar1;
  __va_list_tag *in_XMM4_Qb;
  char *in_XMM5_Qa;
  sqlite3 *in_XMM5_Qb;
  char *z;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  sqlite3 *in_stack_ffffffffffffffa0;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff90 = in_XMM4_Qb;
    in_stack_ffffffffffffff98 = in_XMM5_Qa;
    in_stack_ffffffffffffffa0 = in_XMM5_Qb;
  }
  pcVar1 = sqlite3VMPrintf(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff90);
  return pcVar1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3MPrintf(sqlite3 *db, const char *zFormat, ...){
  va_list ap;
  char *z;
  va_start(ap, zFormat);
  z = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  return z;
}